

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int witness_stack_from_bytes(uchar *bytes,wally_tx_witness_stack **witness,uint64_t *offset)

{
  int iVar1;
  size_t sVar2;
  size_t local_48;
  uint64_t witness_len;
  uchar *p;
  uint64_t num_witnesses;
  size_t i;
  uint64_t *puStack_20;
  int ret;
  uint64_t *offset_local;
  wally_tx_witness_stack **witness_local;
  uchar *bytes_local;
  
  i._4_4_ = 0;
  witness_len = (uint64_t)bytes;
  puStack_20 = offset;
  offset_local = (uint64_t *)witness;
  witness_local = (wally_tx_witness_stack **)bytes;
  sVar2 = varint_from_bytes(bytes,(uint64_t *)&p);
  witness_len = sVar2 + witness_len;
  if (p != (uchar *)0x0) {
    iVar1 = wally_tx_witness_stack_init_alloc((size_t)p,(wally_tx_witness_stack **)offset_local);
    if (iVar1 != 0) {
      return iVar1;
    }
    for (num_witnesses = 0; i._4_4_ = 0, num_witnesses < p; num_witnesses = num_witnesses + 1) {
      sVar2 = varint_from_bytes((uchar *)witness_len,&local_48);
      witness_len = sVar2 + witness_len;
      iVar1 = wally_tx_witness_stack_set
                        ((wally_tx_witness_stack *)*offset_local,num_witnesses,(uchar *)witness_len,
                         local_48);
      if (iVar1 != 0) {
        return iVar1;
      }
      witness_len = local_48 + witness_len;
    }
  }
  *puStack_20 = witness_len - (long)witness_local;
  return i._4_4_;
}

Assistant:

static int witness_stack_from_bytes(const unsigned char *bytes, struct wally_tx_witness_stack **witness, uint64_t *offset)
{
    int ret = WALLY_OK;
    size_t i;
    uint64_t num_witnesses;
    const unsigned char *p = bytes;
    p += varint_from_bytes(p, &num_witnesses);
    if (num_witnesses) {
        ret = wally_tx_witness_stack_init_alloc(num_witnesses, witness);
        if (ret != WALLY_OK)
            goto cleanup;

        for (i = 0; i < num_witnesses; ++i) {
            uint64_t witness_len;
            p += varint_from_bytes(p, &witness_len);
            ret = wally_tx_witness_stack_set(*witness, i, p, witness_len);
            if (ret != WALLY_OK)
                goto cleanup;
            p += witness_len;
        }
    }

    *offset = p - bytes;

cleanup:
    return ret;
}